

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderMaxOutputComponentsTest::prepareFragmentShader
          (GeometryShaderMaxOutputComponentsTest *this,string *out_shader_code)

{
  ostream *poVar1;
  string local_1d8 [36];
  int local_1b4;
  int local_1b0;
  int i_1;
  int i;
  stringstream local_1a0 [8];
  stringstream stream;
  ostream local_190;
  string *local_18;
  string *out_shader_code_local;
  GeometryShaderMaxOutputComponentsTest *this_local;
  
  local_18 = out_shader_code;
  out_shader_code_local = (string *)this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(&local_190,"${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\nprecision highp int;\n\n");
  std::operator<<(&local_190,"// definitions of gs_fs_out_ varyings go here\n");
  for (local_1b0 = 0; local_1b0 < this->m_n_available_vectors; local_1b0 = local_1b0 + 1) {
    poVar1 = std::operator<<(&local_190,"flat in ivec4");
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,"gs_fs_out_");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1b0);
    std::operator<<(poVar1,";\n");
  }
  std::operator<<(&local_190,
                  "\nlayout(location = 0) out int fs_out;\n\nvoid main()\n{\n    int sum = 0;\n\n    // sum calculation go here\n"
                 );
  for (local_1b4 = 0; local_1b4 < this->m_n_available_vectors; local_1b4 = local_1b4 + 1) {
    poVar1 = std::operator<<(&local_190,"    ");
    poVar1 = std::operator<<(poVar1,"sum += ");
    poVar1 = std::operator<<(poVar1,"gs_fs_out_");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1b4);
    poVar1 = std::operator<<(poVar1,".x + ");
    poVar1 = std::operator<<(poVar1,"gs_fs_out_");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1b4);
    poVar1 = std::operator<<(poVar1,".y + ");
    poVar1 = std::operator<<(poVar1,"gs_fs_out_");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1b4);
    poVar1 = std::operator<<(poVar1,".z + ");
    poVar1 = std::operator<<(poVar1,"gs_fs_out_");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1b4);
    std::operator<<(poVar1,".w;\n");
  }
  std::operator<<(&local_190,"\n    fs_out = sum;\n}\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)local_18,local_1d8);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void GeometryShaderMaxOutputComponentsTest::prepareFragmentShader(std::string& out_shader_code) const
{
	std::stringstream stream;

	stream << m_fragment_shader_code_preamble;
	stream << m_common_shader_code_gs_fs_out_definitions;

	for (int i = 0; i < m_n_available_vectors; ++i)
	{
		stream << m_fragment_shader_code_flat_in_ivec4 << " " << m_common_shader_code_gs_fs_out << i << ";\n";
	}

	stream << m_fragment_shader_code_body_begin;

	for (int i = 0; i < m_n_available_vectors; ++i)
	{
		stream << "    " << m_fragment_shader_code_sum << m_common_shader_code_gs_fs_out << i << ".x + "
			   << m_common_shader_code_gs_fs_out << i << ".y + " << m_common_shader_code_gs_fs_out << i << ".z + "
			   << m_common_shader_code_gs_fs_out << i << ".w;\n";
	}

	stream << m_fragment_shader_code_body_end;

	out_shader_code = stream.str();
}